

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::is_socket_alive(socket_t sock)

{
  bool bVar1;
  ssize_t sVar2;
  int *piVar3;
  int unaff_retaddr;
  socket_t unaff_retaddr_00;
  size_t in_stack_00000028;
  void *in_stack_00000030;
  char buf [1];
  
  sVar2 = select_read(sock,0,0);
  if (sVar2 == 0) {
    bVar1 = true;
  }
  else {
    if ((sVar2 < 0) && (piVar3 = __errno_location(), *piVar3 == 9)) {
      return false;
    }
    sVar2 = read_socket(unaff_retaddr_00,in_stack_00000030,in_stack_00000028,unaff_retaddr);
    bVar1 = 0 < sVar2;
  }
  return bVar1;
}

Assistant:

inline bool is_socket_alive(socket_t sock) {
  const auto val = detail::select_read(sock, 0, 0);
  if (val == 0) {
    return true;
  } else if (val < 0 && errno == EBADF) {
    return false;
  }
  char buf[1];
  return detail::read_socket(sock, &buf[0], sizeof(buf), MSG_PEEK) > 0;
}